

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
pstore::json::details::number_matcher<pstore::json::null_output>::do_exponent_digit_state
          (number_matcher<pstore::json::null_output> *this,parser<pstore::json::null_output> *parser
          ,char c)

{
  parser<pstore::json::null_output> *parser_00;
  int iVar1;
  error_code local_30;
  byte local_1a;
  char local_19;
  bool match;
  parser<pstore::json::null_output> *ppStack_18;
  char c_local;
  parser<pstore::json::null_output> *parser_local;
  number_matcher<pstore::json::null_output> *this_local;
  
  local_19 = c;
  ppStack_18 = parser;
  parser_local = (parser<pstore::json::null_output> *)this;
  iVar1 = matcher<pstore::json::null_output>::get_state
                    (&this->super_matcher<pstore::json::null_output>);
  if ((iVar1 != 10) &&
     (iVar1 = matcher<pstore::json::null_output>::get_state
                        (&this->super_matcher<pstore::json::null_output>), iVar1 != 9)) {
    assert_failed("this->get_state () == exponent_digit_state || this->get_state () == exponent_initial_digit_state"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x2ab);
  }
  if (((this->super_matcher<pstore::json::null_output>).field_0xd & 1) != 0) {
    assert_failed("!is_integer_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x2ac);
  }
  local_1a = 1;
  if ((local_19 < '0') || ('9' < local_19)) {
    iVar1 = matcher<pstore::json::null_output>::get_state
                      (&this->super_matcher<pstore::json::null_output>);
    parser_00 = ppStack_18;
    if (iVar1 == 9) {
      std::error_code::error_code<pstore::json::error_code,void>(&local_30,unrecognized_token);
      matcher<pstore::json::null_output>::set_error
                (&this->super_matcher<pstore::json::null_output>,parser_00,&local_30);
    }
    else {
      local_1a = 0;
      complete(this,ppStack_18);
    }
  }
  else {
    (this->fp_acc_).exponent = (this->fp_acc_).exponent * 10 + local_19 + -0x30;
    matcher<pstore::json::null_output>::set_state
              (&this->super_matcher<pstore::json::null_output>,10);
  }
  return (bool)(local_1a & 1);
}

Assistant:

bool number_matcher<Callbacks>::do_exponent_digit_state (parser<Callbacks> & parser,
                                                                     char const c) {
                PSTORE_ASSERT (this->get_state () == exponent_digit_state ||
                               this->get_state () == exponent_initial_digit_state);
                PSTORE_ASSERT (!is_integer_);

                bool match = true;
                if (c >= '0' && c <= '9') {
                    fp_acc_.exponent = fp_acc_.exponent * 10U + static_cast<unsigned> (c - '0');
                    this->set_state (exponent_digit_state);
                } else {
                    if (this->get_state () == exponent_initial_digit_state) {
                        this->set_error (parser, error_code::unrecognized_token);
                    } else {
                        match = false;
                        this->complete (parser);
                    }
                }
                return match;
            }